

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

int Gia_ManFilterEquivsUsingParts(Gia_Man_t *pGia,char *pName1,char *pName2)

{
  Gia_Obj_t *__s2;
  bool bVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *p0;
  Gia_Man_t *p1;
  Gia_Man_t *p;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *p_00;
  bool bVar5;
  int fSeenB;
  int fSeenA;
  int iLitsNew;
  int iLitsOld;
  int iRepr;
  int iPrev;
  int iNext;
  int iObj;
  int k;
  int i;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pObjM;
  Gia_Obj_t *pObj2;
  Gia_Obj_t *pObj1;
  Gia_Man_t *pMiter;
  Gia_Man_t *pGia2;
  Gia_Man_t *pGia1;
  Vec_Int_t *vNodes;
  char *pName2_local;
  char *pName1_local;
  Gia_Man_t *pGia_local;
  
  _k = (Gia_Obj_t *)0x0;
  if ((pGia->pReprs == (Gia_Rpr_t *)0x0) || (pGia->pNexts == (int *)0x0)) {
    Abc_Print(1,"Equivalences are not defined.\n");
    pGia_local._4_4_ = 0;
  }
  else {
    p0 = Gia_AigerRead(pName1,0,0,0);
    if (p0 == (Gia_Man_t *)0x0) {
      Abc_Print(1,"Cannot read first file %s.\n",pName1);
      pGia_local._4_4_ = 0;
    }
    else {
      p1 = Gia_AigerRead(pName2,0,0,0);
      if (p1 == (Gia_Man_t *)0x0) {
        Gia_ManStop((Gia_Man_t *)0x0);
        Abc_Print(1,"Cannot read second file %s.\n",pName2);
        pGia_local._4_4_ = 0;
      }
      else {
        p = Gia_ManMiter(p0,p1,0,0,1,0,0);
        if (p == (Gia_Man_t *)0x0) {
          Gia_ManStop(p0);
          Gia_ManStop(p1);
          Abc_Print(1,"Cannot create sequential miter.\n");
          pGia_local._4_4_ = 0;
        }
        else {
          iVar2 = Gia_ManObjNum(pGia);
          iVar3 = Gia_ManObjNum(p);
          if (iVar2 == iVar3) {
            pGVar4 = pGia->pObjs;
            __s2 = p->pObjs;
            iVar2 = Gia_ManObjNum(pGia);
            iVar2 = memcmp(pGVar4,__s2,(long)iVar2 * 0xc);
            if (iVar2 == 0) {
              Gia_ManCleanMark0(pGia);
              iObj = 0;
              while( true ) {
                bVar5 = false;
                if (iObj < p0->nObjs) {
                  pObj2 = Gia_ManObj(p0,iObj);
                  bVar5 = pObj2 != (Gia_Obj_t *)0x0;
                }
                if (!bVar5) break;
                if (pObj2->Value != 0xffffffff) {
                  iVar2 = Abc_Lit2Var(pObj2->Value);
                  pGVar4 = Gia_ManObj(p,iVar2);
                  iVar2 = Gia_ObjId(p,pGVar4);
                  _k = Gia_ManObj(pGia,iVar2);
                  *(ulong *)_k = *(ulong *)_k & 0xffffffffbfffffff | 0x40000000;
                }
                iObj = iObj + 1;
              }
              Gia_ManCleanMark1(pGia);
              iObj = 0;
              while( true ) {
                bVar5 = false;
                if (iObj < p1->nObjs) {
                  pObjM = Gia_ManObj(p1,iObj);
                  bVar5 = pObjM != (Gia_Obj_t *)0x0;
                }
                if (!bVar5) break;
                if (pObjM->Value != 0xffffffff) {
                  iVar2 = Abc_Lit2Var(pObjM->Value);
                  pGVar4 = Gia_ManObj(p,iVar2);
                  iVar2 = Gia_ObjId(p,pGVar4);
                  _k = Gia_ManObj(pGia,iVar2);
                  *(ulong *)_k = *(ulong *)_k & 0xbfffffffffffffff | 0x4000000000000000;
                }
                iObj = iObj + 1;
              }
              fSeenB = 0;
              fSeenA = 0;
              for (iObj = 1; iVar2 = Gia_ManObjNum(pGia), iObj < iVar2; iObj = iObj + 1) {
                iVar2 = Gia_ObjIsConst(pGia,iObj);
                if (iVar2 != 0) {
                  fSeenA = fSeenA + 1;
                  _k = Gia_ManObj(pGia,iObj);
                  if (pGia->pNexts[iObj] != 0) {
                    __assert_fail("pGia->pNexts[i] == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                                  ,0x973,
                                  "int Gia_ManFilterEquivsUsingParts(Gia_Man_t *, char *, char *)");
                  }
                  if (((*(ulong *)_k >> 0x1e & 1) == 0) && ((*(ulong *)_k >> 0x3e & 1) == 0)) {
                    __assert_fail("pObj->fMark0 || pObj->fMark1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                                  ,0x974,
                                  "int Gia_ManFilterEquivsUsingParts(Gia_Man_t *, char *, char *)");
                  }
                  if (((*(ulong *)_k >> 0x1e & 1) == 0) || ((*(ulong *)_k >> 0x3e & 1) == 0)) {
                    fSeenB = fSeenB + 1;
                  }
                  else {
                    Gia_ObjUnsetRepr(pGia,iObj);
                  }
                }
              }
              p_00 = Vec_IntAlloc(100);
              for (iObj = 1; iVar2 = Gia_ManObjNum(pGia), iObj < iVar2; iObj = iObj + 1) {
                iVar2 = Gia_ObjIsHead(pGia,iObj);
                if (iVar2 != 0) {
                  bVar5 = false;
                  bVar1 = false;
                  if (((*(ulong *)_k >> 0x1e & 1) == 0) && ((*(ulong *)_k >> 0x3e & 1) == 0)) {
                    __assert_fail("pObj->fMark0 || pObj->fMark1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                                  ,0x97f,
                                  "int Gia_ManFilterEquivsUsingParts(Gia_Man_t *, char *, char *)");
                  }
                  Vec_IntClear(p_00);
                  iVar2 = Gia_ObjIsHead(pGia,iObj);
                  if (iVar2 == 0) {
                    __assert_fail("Gia_ObjIsHead(pGia, i)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                                  ,0x981,
                                  "int Gia_ManFilterEquivsUsingParts(Gia_Man_t *, char *, char *)");
                  }
                  for (iPrev = iObj; 0 < iPrev; iPrev = Gia_ObjNext(pGia,iPrev)) {
                    _k = Gia_ManObj(pGia,iPrev);
                    if (((*(ulong *)_k >> 0x1e & 1) != 0) && ((*(ulong *)_k >> 0x3e & 1) == 0)) {
                      bVar5 = true;
                      Vec_IntPush(p_00,iPrev);
                    }
                    if (((*(ulong *)_k >> 0x1e & 1) == 0) && ((*(ulong *)_k >> 0x3e & 1) != 0)) {
                      bVar1 = true;
                      Vec_IntPush(p_00,iPrev);
                    }
                    fSeenA = fSeenA + 1;
                  }
                  fSeenA = fSeenA + -1;
                  iPrev = iObj;
                  iRepr = Gia_ObjNext(pGia,iObj);
                  while (iPrev != 0) {
                    Gia_ObjUnsetRepr(pGia,iPrev);
                    Gia_ObjSetNext(pGia,iPrev,0);
                    iPrev = iRepr;
                    iRepr = Gia_ObjNext(pGia,iRepr);
                  }
                  iVar2 = Gia_ObjIsHead(pGia,iObj);
                  if (iVar2 != 0) {
                    __assert_fail("!Gia_ObjIsHead(pGia, i)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                                  ,0x998,
                                  "int Gia_ManFilterEquivsUsingParts(Gia_Man_t *, char *, char *)");
                  }
                  if (((bVar5) && (bVar1)) && (iVar2 = Vec_IntSize(p_00), 1 < iVar2)) {
                    iVar2 = Vec_IntEntry(p_00,0);
                    iLitsOld = iVar2;
                    for (iNext = 1; iVar3 = Vec_IntSize(p_00), iNext < iVar3; iNext = iNext + 1) {
                      iVar3 = Vec_IntEntry(p_00,iNext);
                      Gia_ObjSetRepr(pGia,iVar3,iVar2);
                      Gia_ObjSetNext(pGia,iLitsOld,iVar3);
                      fSeenB = fSeenB + 1;
                      iLitsOld = iVar3;
                    }
                    iVar2 = Gia_ObjNext(pGia,iLitsOld);
                    if (iVar2 != 0) {
                      __assert_fail("Gia_ObjNext(pGia, iPrev) == 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                                    ,0x9a4,
                                    "int Gia_ManFilterEquivsUsingParts(Gia_Man_t *, char *, char *)"
                                   );
                    }
                  }
                }
              }
              Vec_IntFree(p_00);
              Abc_Print(1,"The number of literals: Before = %d. After = %d.\n",(ulong)(uint)fSeenA,
                        (ulong)(uint)fSeenB);
              Gia_ManCleanMark0(pGia);
              Gia_ManCleanMark1(pGia);
              pGia_local._4_4_ = 1;
            }
            else {
              Gia_ManStop(p0);
              Gia_ManStop(p1);
              Gia_ManStop(p);
              Abc_Print(1,"The AIG structure of the miter does not match.\n");
              pGia_local._4_4_ = 0;
            }
          }
          else {
            Gia_ManStop(p0);
            Gia_ManStop(p1);
            Gia_ManStop(p);
            Abc_Print(1,"The number of objects in different.\n");
            pGia_local._4_4_ = 0;
          }
        }
      }
    }
  }
  return pGia_local._4_4_;
}

Assistant:

int Gia_ManFilterEquivsUsingParts( Gia_Man_t * pGia, char * pName1, char * pName2 )
{
    Vec_Int_t * vNodes;
    Gia_Man_t * pGia1, * pGia2, * pMiter;
    Gia_Obj_t * pObj1, * pObj2, * pObjM, * pObj = NULL;
    int i, k, iObj, iNext, iPrev, iRepr;
    int iLitsOld, iLitsNew;
    if ( pGia->pReprs == NULL || pGia->pNexts == NULL )
    {
        Abc_Print( 1, "Equivalences are not defined.\n" );
        return 0;
    }
    pGia1 = Gia_AigerRead( pName1, 0, 0, 0 );
    if ( pGia1 == NULL )
    {
        Abc_Print( 1, "Cannot read first file %s.\n", pName1 );
        return 0;
    }
    pGia2 = Gia_AigerRead( pName2, 0, 0, 0 );
    if ( pGia2 == NULL )
    {
        Gia_ManStop( pGia2 );
        Abc_Print( 1, "Cannot read second file %s.\n", pName2 );
        return 0;
    }
    pMiter = Gia_ManMiter( pGia1, pGia2, 0, 0, 1, 0, 0 );
    if ( pMiter == NULL )
    {
        Gia_ManStop( pGia1 );
        Gia_ManStop( pGia2 );
        Abc_Print( 1, "Cannot create sequential miter.\n" );
        return 0;
    }
    // make sure the miter is isomorphic
    if ( Gia_ManObjNum(pGia) != Gia_ManObjNum(pMiter) )
    {
        Gia_ManStop( pGia1 );
        Gia_ManStop( pGia2 );
        Gia_ManStop( pMiter );
        Abc_Print( 1, "The number of objects in different.\n" );
        return 0;
    }
    if ( memcmp( pGia->pObjs, pMiter->pObjs, sizeof(Gia_Obj_t) *  Gia_ManObjNum(pGia) ) )
    {
        Gia_ManStop( pGia1 );
        Gia_ManStop( pGia2 );
        Gia_ManStop( pMiter );
        Abc_Print( 1, "The AIG structure of the miter does not match.\n" );
        return 0;
    }
    // transfer copies
    Gia_ManCleanMark0( pGia );
    Gia_ManForEachObj( pGia1, pObj1, i )
    {
        if ( pObj1->Value == ~0 )
            continue;
        pObjM = Gia_ManObj( pMiter, Abc_Lit2Var(pObj1->Value) );
        pObj = Gia_ManObj( pGia, Gia_ObjId(pMiter, pObjM) );
        pObj->fMark0 = 1;
    }
    Gia_ManCleanMark1( pGia );
    Gia_ManForEachObj( pGia2, pObj2, i )
    {
        if ( pObj2->Value == ~0 )
            continue;
        pObjM = Gia_ManObj( pMiter, Abc_Lit2Var(pObj2->Value) );
        pObj = Gia_ManObj( pGia, Gia_ObjId(pMiter, pObjM) );
        pObj->fMark1 = 1;
    }

    // filter equivalences
    iLitsOld = iLitsNew = 0;
    Gia_ManForEachConst( pGia, i )
    {
        iLitsOld++;
        pObj = Gia_ManObj( pGia, i );
        assert( pGia->pNexts[i] == 0 );
        assert( pObj->fMark0 || pObj->fMark1 );
        if ( pObj->fMark0 && pObj->fMark1 ) // belongs to both A and B
            Gia_ObjUnsetRepr( pGia, i );
        else
            iLitsNew++;
    }
    // filter equivalences
    vNodes = Vec_IntAlloc( 100 );
    Gia_ManForEachClass( pGia, i )
    {
        int fSeenA = 0, fSeenB = 0;
        assert( pObj->fMark0 || pObj->fMark1 );
        Vec_IntClear( vNodes );
        Gia_ClassForEachObj( pGia, i, iObj )
        {
            pObj = Gia_ManObj( pGia, iObj );
            if ( pObj->fMark0 && !pObj->fMark1 )
            {
                fSeenA = 1;
                Vec_IntPush( vNodes, iObj );
            }
            if ( !pObj->fMark0 && pObj->fMark1 )
            {
                fSeenB = 1;
                Vec_IntPush( vNodes, iObj );
            }
            iLitsOld++;
        }
        iLitsOld--;
        // undo equivalence classes
        for ( iObj = i, iNext = Gia_ObjNext(pGia, iObj); iObj;
              iObj = iNext, iNext = Gia_ObjNext(pGia, iObj) )
        {
            Gia_ObjUnsetRepr( pGia, iObj );
            Gia_ObjSetNext( pGia, iObj, 0 );
        }
        assert( !Gia_ObjIsHead(pGia, i) );
        if ( fSeenA && fSeenB && Vec_IntSize(vNodes) > 1 )
        {
            // create new class
            iPrev = iRepr = Vec_IntEntry( vNodes, 0 );
            Vec_IntForEachEntryStart( vNodes, iObj, k, 1 )
            {
                Gia_ObjSetRepr( pGia, iObj, iRepr );
                Gia_ObjSetNext( pGia, iPrev, iObj );
                iPrev = iObj;
                iLitsNew++;
            }
            assert( Gia_ObjNext(pGia, iPrev) == 0 );
        }
    }
    Vec_IntFree( vNodes );
    Abc_Print( 1, "The number of literals: Before = %d. After = %d.\n", iLitsOld, iLitsNew );
//Gia_ManEquivPrintClasses( pGia, 1, 0 );

    Gia_ManCleanMark0( pGia );
    Gia_ManCleanMark1( pGia );
    return 1;
}